

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O2

void slider_click(t_slider *x,t_floatarg xpos,t_floatarg ypos,t_floatarg shift,t_floatarg ctrl,
                 t_floatarg alt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  float fVar5;
  t_float tVar6;
  
  if (x->x_orientation == horizontal) {
    iVar3 = text_xpix((t_text *)x,(x->x_gui).x_glist);
    fVar5 = xpos - (float)iVar3;
    piVar4 = &(x->x_gui).x_w;
  }
  else {
    piVar4 = &(x->x_gui).x_h;
    iVar3 = (x->x_gui).x_h;
    iVar1 = text_ypix((t_text *)x,(x->x_gui).x_glist);
    fVar5 = (float)(iVar1 + iVar3) - ypos;
  }
  iVar3 = ((x->x_gui).x_glist)->gl_zoom;
  iVar1 = (*piVar4 / iVar3) * 100 + -100;
  if (x->x_steady == 0) {
    iVar3 = (int)((fVar5 * 100.0) / (float)iVar3);
    x->x_val = iVar3;
  }
  else {
    iVar3 = x->x_val;
  }
  iVar2 = iVar1;
  if (iVar3 < iVar1) {
    iVar2 = iVar3;
  }
  if ((iVar1 < iVar3) || (iVar2 < 0)) {
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    x->x_val = iVar3;
  }
  tVar6 = slider_getfval(x);
  x->x_fval = tVar6;
  x->x_pos = x->x_val;
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  slider_bang(x);
  glist_grab((x->x_gui).x_glist,(t_gobj *)x,slider_motion,(t_glistkeyfn)0x0,(int)xpos,(int)ypos);
  return;
}

Assistant:

static void slider_click(t_slider *x, t_floatarg xpos, t_floatarg ypos,
    t_floatarg shift, t_floatarg ctrl, t_floatarg alt)
{
    t_float val;
    int maxval;
    if(x->x_orientation == horizontal)
    {
        val = (xpos - text_xpix(&x->x_gui.x_obj, x->x_gui.x_glist));
        maxval = x->x_gui.x_w / IEMGUI_ZOOM(x);
    } else {
        val = (x->x_gui.x_h + text_ypix(&x->x_gui.x_obj, x->x_gui.x_glist) - ypos);
        maxval = x->x_gui.x_h / IEMGUI_ZOOM(x);
    }
    maxval = 100 * maxval - 100;

    if(!x->x_steady)
        x->x_val = (int)((100.0 * val) / IEMGUI_ZOOM(x));
    if(x->x_val > maxval)
        x->x_val = maxval;

    if(x->x_val < 0)
        x->x_val = 0;
    x->x_fval = slider_getfval(x);
    x->x_pos = x->x_val;
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
    slider_bang(x);
    glist_grab(x->x_gui.x_glist, &x->x_gui.x_obj.te_g,
        (t_glistmotionfn)slider_motion, 0, xpos, ypos);
}